

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::detail::ReductionFunctor<void,_diy::RegularSwapPartners>::operator()
          (ReductionFunctor<void,_diy::RegularSwapPartners> *this,void *b,ProxyWithLink *cp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Master *pMVar4;
  size_t sVar5;
  ReduceProxy *this_00;
  Link *this_01;
  Proxy *in_RDX;
  int *in_RDI;
  BlockID target;
  const_iterator __end4;
  const_iterator __begin4;
  Neighbors *__range4;
  OutgoingQueues *outgoing;
  ReduceProxy rp;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  Master *in_stack_fffffffffffffe48;
  RegularSwapPartners *__args_2;
  ReduceProxy *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  key_type *__k;
  int iVar6;
  __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
  in_stack_fffffffffffffea8;
  Assigner *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  uint round;
  void *in_stack_fffffffffffffec0;
  Master *in_stack_fffffffffffffec8;
  ReduceProxy *in_stack_fffffffffffffed0;
  GIDVector *in_stack_fffffffffffffee0;
  undefined1 local_48 [72];
  
  round = (uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  __k = (key_type *)(in_RDI + 10);
  iVar6 = *in_RDI;
  local_48._48_8_ = in_RDX;
  iVar2 = Master::Proxy::gid(in_RDX);
  pMVar4 = Master::Proxy::master((Proxy *)local_48._48_8_);
  bVar1 = RegularSwapPartners::active((RegularSwapPartners *)__k,iVar6,iVar2,pMVar4);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bd617);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bd624);
    if (0 < *in_RDI) {
      Master::Proxy::gid((Proxy *)local_48._48_8_);
      Master::Proxy::master((Proxy *)local_48._48_8_);
      RegularSwapPartners::incoming
                ((RegularSwapPartners *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
    }
    iVar3 = *in_RDI;
    sVar5 = RegularPartners::rounds((RegularPartners *)0x1bd6b1);
    if (iVar3 < (int)sVar5) {
      in_stack_fffffffffffffe58 = in_RDI + 10;
      in_stack_fffffffffffffe64 = *in_RDI;
      Master::Proxy::gid((Proxy *)local_48._48_8_);
      Master::Proxy::master((Proxy *)local_48._48_8_);
      RegularSwapPartners::outgoing
                ((RegularSwapPartners *)
                 CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe48);
    }
    __args_2 = (RegularSwapPartners *)local_48;
    ReduceProxy::ReduceProxy
              (in_stack_fffffffffffffed0,(Proxy *)in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0,round,in_stack_fffffffffffffeb0,
               (GIDVector *)in_stack_fffffffffffffea8._M_current,in_stack_fffffffffffffee0);
    std::function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>::
    operator()((function<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,__args_2);
    Master::Proxy::outgoing((Proxy *)&stack0xfffffffffffffec0);
    this_00 = (ReduceProxy *)
              std::
              map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
              ::size((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)0x1bd78c);
    ReduceProxy::out_link((ReduceProxy *)&stack0xfffffffffffffec0);
    iVar3 = Link::size((Link *)0x1bd7a3);
    if (this_00 < (ReduceProxy *)(long)iVar3) {
      this_01 = ReduceProxy::out_link((ReduceProxy *)&stack0xfffffffffffffec0);
      Link::neighbors(this_01);
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::begin
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::end
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)this_00,
                                (__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)__args_2), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator*((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                     *)&stack0xfffffffffffffea8);
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)CONCAT44(iVar2,iVar6),__k);
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator++((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                      *)&stack0xfffffffffffffea8);
      }
    }
    ReduceProxy::~ReduceProxy(this_00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }